

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O2

int deflateParams(z_streamp_conflict strm,int level,int strategy)

{
  internal_state_conflict *piVar1;
  int iVar2;
  uint uVar3;
  
  iVar2 = -2;
  if ((strm != (z_streamp_conflict)0x0) &&
     (piVar1 = strm->state, piVar1 != (internal_state_conflict *)0x0)) {
    uVar3 = 6;
    if (level != -1) {
      uVar3 = level;
    }
    if ((uint)strategy < 5 && uVar3 < 10) {
      if (((piVar1->strategy == strategy) &&
          (configuration_table[piVar1->level].func == configuration_table[uVar3].func)) ||
         (strm->total_in == 0)) {
        iVar2 = 0;
      }
      else {
        iVar2 = deflate(strm,5);
        if (iVar2 == -5) {
          iVar2 = (uint)(piVar1->pending == 0) * 5 + -5;
        }
      }
      if (piVar1->level != uVar3) {
        piVar1->level = uVar3;
        piVar1->max_lazy_match = (uint)configuration_table[uVar3].max_lazy;
        piVar1->good_match = (uint)configuration_table[uVar3].good_length;
        piVar1->nice_match = (uint)configuration_table[uVar3].nice_length;
        piVar1->max_chain_length = (uint)configuration_table[uVar3].max_chain;
      }
      piVar1->strategy = strategy;
    }
  }
  return iVar2;
}

Assistant:

int ZEXPORT deflateParams(strm, level, strategy)
    z_streamp strm;
    int level;
    int strategy;
{
    deflate_state *s;
    compress_func func;
    int err = Z_OK;

    if (strm == Z_NULL || strm->state == Z_NULL) return Z_STREAM_ERROR;
    s = strm->state;

#ifdef FASTEST
    if (level != 0) level = 1;
#else
    if (level == Z_DEFAULT_COMPRESSION) level = 6;
#endif
    if (level < 0 || level > 9 || strategy < 0 || strategy > Z_FIXED) {
        return Z_STREAM_ERROR;
    }
    func = configuration_table[s->level].func;

    if ((strategy != s->strategy || func != configuration_table[level].func) &&
        strm->total_in != 0) {
        /* Flush the last buffer: */
        err = deflate(strm, Z_BLOCK);
        if (err == Z_BUF_ERROR && s->pending == 0)
            err = Z_OK;
    }
    if (s->level != level) {
        s->level = level;
        s->max_lazy_match   = configuration_table[level].max_lazy;
        s->good_match       = configuration_table[level].good_length;
        s->nice_match       = configuration_table[level].nice_length;
        s->max_chain_length = configuration_table[level].max_chain;
    }
    s->strategy = strategy;
    return err;
}